

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

bool __thiscall
slang::ast::DiagnosticVisitor::handleDefault<slang::ast::IteratorSymbol>
          (DiagnosticVisitor *this,IteratorSymbol *symbol)

{
  DeclaredType *pDVar1;
  iterator ppAVar2;
  AttributeSymbol *attr;
  iterator __end0;
  iterator __begin0;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *local_30;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *__range4;
  not_null<const_slang::ast::DeclaredType_*> declaredType;
  IteratorSymbol *symbol_local;
  DiagnosticVisitor *this_local;
  
  if (((ulong)this->errorLimit < *this->numErrors) || ((this->hierarchyProblem & 1U) != 0)) {
    this_local._7_1_ = false;
  }
  else {
    declaredType.ptr = (DeclaredType *)symbol;
    __range4 = (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)
               ValueSymbol::getDeclaredType((ValueSymbol *)symbol);
    pDVar1 = not_null::operator_cast_to_DeclaredType_((not_null *)&__range4);
    if (pDVar1 != (DeclaredType *)0x0) {
      pDVar1 = not_null<const_slang::ast::DeclaredType_*>::operator->
                         ((not_null<const_slang::ast::DeclaredType_*> *)&__range4);
      DeclaredType::getType(pDVar1);
      pDVar1 = not_null<const_slang::ast::DeclaredType_*>::operator->
                         ((not_null<const_slang::ast::DeclaredType_*> *)&__range4);
      DeclaredType::getInitializer(pDVar1);
    }
    ___begin0 = Compilation::getAttributes(this->compilation,(Symbol *)declaredType.ptr);
    local_30 = (span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *)&__begin0;
    __end0 = nonstd::span_lite::
             span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::begin(local_30)
    ;
    ppAVar2 = nonstd::span_lite::
              span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL>::end(local_30);
    for (; __end0 != ppAVar2; __end0 = __end0 + 1) {
      AttributeSymbol::getValue(*__end0);
    }
    ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false>::
    visitDefault<slang::ast::IteratorSymbol>
              ((ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false> *)this,
               (IteratorSymbol *)declaredType.ptr);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool handleDefault(const T& symbol) {
        if (numErrors > errorLimit || hierarchyProblem)
            return false;

        if constexpr (std::is_base_of_v<Symbol, T>) {
            auto declaredType = symbol.getDeclaredType();
            if (declaredType) {
                declaredType->getType();
                declaredType->getInitializer();
            }

            if constexpr (std::is_same_v<ParameterSymbol, T> ||
                          std::is_same_v<EnumValueSymbol, T> ||
                          std::is_same_v<SpecparamSymbol, T>) {
                symbol.getValue();
            }

            for (auto attr : compilation.getAttributes(symbol))
                attr->getValue();
        }

        if constexpr (is_detected_v<getBody_t, T>) {
            auto& body = symbol.getBody();
            if (body.bad())
                return true;

            body.visit(*this);
        }

        visitDefault(symbol);
        return true;
    }